

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

void nk_list_view_end(nk_list_view *view)

{
  nk_context *ctx;
  nk_uint *pnVar1;
  nk_panel *pnVar2;
  
  if (view == (nk_list_view *)0x0) {
    __assert_fail("view",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                  ,0x4949,"void nk_list_view_end(struct nk_list_view *)");
  }
  ctx = view->ctx;
  if (ctx != (nk_context *)0x0) {
    pnVar1 = view->scroll_pointer;
    if (pnVar1 != (nk_uint *)0x0) {
      pnVar2 = ctx->current->layout;
      pnVar2->at_y = (float)view->total_height + (pnVar2->bounds).y;
      *pnVar1 = *pnVar1 + view->scroll_value;
      nk_group_scrolled_end(ctx);
      return;
    }
    __assert_fail("view->scroll_pointer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                  ,0x494b,"void nk_list_view_end(struct nk_list_view *)");
  }
  __assert_fail("view->ctx",
                "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                ,0x494a,"void nk_list_view_end(struct nk_list_view *)");
}

Assistant:

NK_API void
nk_list_view_end(struct nk_list_view *view)
{
    struct nk_context *ctx;
    struct nk_window *win;
    struct nk_panel *layout;

    NK_ASSERT(view);
    NK_ASSERT(view->ctx);
    NK_ASSERT(view->scroll_pointer);
    if (!view || !view->ctx) return;

    ctx = view->ctx;
    win = ctx->current;
    layout = win->layout;
    layout->at_y = layout->bounds.y + (float)view->total_height;
    *view->scroll_pointer = *view->scroll_pointer + view->scroll_value;
    nk_group_end(view->ctx);
}